

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O2

ssize_t __thiscall XmlRpc::XmlRpcValue::write(XmlRpcValue *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  tm *ptVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  reference this_00;
  uint *__n_00;
  int *__n_01;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  ostream *ostream_in;
  ulong uVar5;
  ulong uVar6;
  size_type __n_02;
  Encoder encoder;
  char buf [20];
  
  ostream_in = (ostream *)CONCAT44(in_register_00000034,__fd);
  __n_00 = &switchD_0028a13a::switchdataD_0029e92c;
  switch(this->_type) {
  case TypeBoolean:
    std::ostream::_M_insert<bool>(SUB41(__fd,0));
    break;
  case TypeInt:
    std::ostream::operator<<((ostream *)ostream_in,(this->_value).asInt);
    break;
  case TypeDouble:
    std::ostream::_M_insert<double>((this->_value).asDouble);
    break;
  case TypeString:
    std::operator<<(ostream_in,(string *)(this->_value).asTime);
    break;
  case TypeDateTime:
    ptVar2 = (this->_value).asTime;
    snprintf(buf,0x13,"%4d%02d%02dT%02d:%02d:%02d",(ulong)(uint)ptVar2->tm_year,
             (ulong)(uint)ptVar2->tm_mon,(ulong)(uint)ptVar2->tm_mday,(ulong)(uint)ptVar2->tm_hour,
             (ulong)(uint)ptVar2->tm_min,(ulong)(uint)ptVar2->tm_sec);
    buf[0x13] = '\0';
    std::operator<<(ostream_in,buf);
    break;
  case TypeBase64:
    std::__cxx11::stringstream::stringstream((stringstream *)buf);
    std::ostream::write(buf + 0x10,(long)(((this->_value).asString)->_M_dataplus)._M_p);
    base64::Encoder::Encoder(&encoder,0x200);
    base64::Encoder::encode(&encoder,(istream *)buf,ostream_in);
    std::__cxx11::stringstream::~stringstream((stringstream *)buf);
    break;
  case TypeArray:
    uVar5 = (ulong)((long)(((this->_value).asBinary)->
                          super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 4;
    std::operator<<(ostream_in,'{');
    __n_02 = 0;
    uVar6 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar6 = __n_02;
    }
    for (; uVar6 != __n_02; __n_02 = __n_02 + 1) {
      if (__n_02 != 0) {
        std::operator<<(ostream_in,',');
      }
      this_00 = std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::at
                          ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
                           (this->_value).asTime,__n_02);
      write(this_00,__fd,__buf_01,(size_t)__n_00);
    }
    cVar1 = '}';
    goto LAB_0028a2ed;
  case TypeStruct:
    std::operator<<(ostream_in,'[');
    ptVar2 = (this->_value).asTime;
    p_Var4 = *(_Rb_tree_node_base **)&ptVar2->tm_wday;
    while (__n_01 = &ptVar2->tm_hour, p_Var4 != (_Rb_tree_node_base *)__n_01) {
      if (p_Var4 != *(_Rb_tree_node_base **)&ptVar2->tm_wday) {
        std::operator<<(ostream_in,',');
      }
      poVar3 = std::operator<<(ostream_in,(string *)(p_Var4 + 1));
      std::operator<<(poVar3,':');
      write((XmlRpcValue *)(p_Var4 + 2),__fd,__buf_00,(size_t)__n_01);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      ptVar2 = (this->_value).asTime;
    }
    cVar1 = ']';
LAB_0028a2ed:
    std::operator<<(ostream_in,cVar1);
  }
  return (ssize_t)ostream_in;
}

Assistant:

std::ostream& XmlRpcValue::write(std::ostream& os) const {
    switch (_type) {
      default:           break;
      case TypeBoolean:  os << _value.asBool; break;
      case TypeInt:      os << _value.asInt; break;
      case TypeDouble:   os << _value.asDouble; break;
      case TypeString:   os << *_value.asString; break;
      case TypeDateTime:
        {
          struct tm* t = _value.asTime;
          char buf[20];
          std::snprintf(buf, sizeof(buf)-1, "%4d%02d%02dT%02d:%02d:%02d", 
            t->tm_year,t->tm_mon,t->tm_mday,t->tm_hour,t->tm_min,t->tm_sec);
          buf[sizeof(buf)-1] = 0;
          os << buf;
          break;
        }
      case TypeBase64:
        {
          std::stringstream buffer;
          buffer.write(_value.asBinary->data(), _value.asBinary->size());
          base64::Encoder encoder;
          encoder.encode(buffer, os);
          break;
        }
      case TypeArray:
        {
          int s = int(_value.asArray->size());
          os << '{';
          for (int i=0; i<s; ++i)
          {
            if (i > 0) os << ',';
            _value.asArray->at(i).write(os);
          }
          os << '}';
          break;
        }
      case TypeStruct:
        {
          os << '[';
          ValueStruct::const_iterator it;
          for (it=_value.asStruct->begin(); it!=_value.asStruct->end(); ++it)
          {
            if (it!=_value.asStruct->begin()) os << ',';
            os << it->first << ':';
            it->second.write(os);
          }
          os << ']';
          break;
        }
    }
    
    return os;
  }